

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O2

int regexpTest(char *filename,char *result,char *err,int options)

{
  uint uVar1;
  int iVar2;
  FILE *__stream;
  char *__filename;
  FILE *__stream_00;
  char *pcVar3;
  size_t sVar4;
  long lVar5;
  undefined4 in_register_0000000c;
  ulong uVar6;
  undefined8 local_13c0;
  char expression [5000];
  
  uVar1 = 0;
  xmlSetStructuredErrorFunc(0,testStructuredErrorHandler,err,CONCAT44(in_register_0000000c,options))
  ;
  nb_tests = nb_tests + 1;
  __stream = fopen64(filename,"rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"Cannot open %s for reading\n",filename);
  }
  else {
    local_13c0 = result;
    __filename = resultFilename(filename,"",".res");
    if (__filename == (char *)0x0) {
      fwrite("Out of memory\n",0xe,1,_stderr);
      fatalError();
    }
    __stream_00 = fopen64(__filename,"wb");
    if (__stream_00 != (FILE *)0x0) {
      lVar5 = 0;
LAB_0010b39d:
      do {
        pcVar3 = fgets(expression,0x1194,__stream);
        if (pcVar3 == (char *)0x0) goto LAB_0010b4c7;
        sVar4 = strlen(expression);
        pcVar3 = expression + (int)sVar4;
        for (uVar6 = sVar4 & 0xffffffff; 0 < (int)(uint)uVar6; uVar6 = uVar6 - 1) {
          if ((0x20 < (ulong)(byte)expression[uVar6 - 1]) ||
             ((0x100002600U >> ((ulong)(byte)expression[uVar6 - 1] & 0x3f) & 1) == 0)) {
            expression[(uint)uVar6 & 0x7fffffff] = '\0';
            if (expression[0] == '#') goto LAB_0010b39d;
            if ((expression[0] == '=') && (expression[1] == '>')) {
              if (lVar5 != 0) {
                xmlRegFreeRegexp(lVar5);
              }
              pcVar3 = expression + 2;
              fprintf(__stream_00,"Regexp: %s\n",pcVar3);
            }
            else {
              if (lVar5 != 0) {
                uVar1 = xmlRegexpExec(lVar5,expression);
                if (uVar1 == 0) {
                  pcVar3 = "%s: Fail\n";
                }
                else {
                  if (uVar1 != 1) {
                    fprintf(__stream_00,"%s: Error: %d\n",expression,(ulong)uVar1);
                    goto LAB_0010b39d;
                  }
                  pcVar3 = "%s: Ok\n";
                }
                fprintf(__stream_00,pcVar3,expression);
                goto LAB_0010b39d;
              }
              fprintf(__stream_00,"Regexp: %s\n",expression);
              pcVar3 = expression;
            }
            lVar5 = xmlRegexpCompile(pcVar3);
            if (lVar5 != 0) goto LAB_0010b39d;
            fwrite("   failed to compile\n",0x15,1,__stream_00);
            lVar5 = 0;
            goto LAB_0010b4c7;
          }
          pcVar3 = pcVar3 + -1;
        }
        *pcVar3 = '\0';
      } while( true );
    }
    uVar1 = 0;
    fprintf(_stderr,"failed to open output file %s\n",__filename);
    free(__filename);
  }
LAB_0010b52e:
  xmlSetStructuredErrorFunc(0,0);
  return uVar1;
LAB_0010b4c7:
  fclose(__stream_00);
  fclose(__stream);
  if (lVar5 != 0) {
    xmlRegFreeRegexp(lVar5);
  }
  pcVar3 = local_13c0;
  iVar2 = compareFiles(__filename,local_13c0);
  if (iVar2 != 0) {
    fprintf(_stderr,"Result for %s failed in %s\n",filename,pcVar3);
  }
  uVar1 = (uint)(iVar2 != 0);
  unlink(__filename);
  free(__filename);
  iVar2 = compareFileMem(err,testErrors,testErrorsSize);
  if (iVar2 != 0) {
    fprintf(_stderr,"Error for %s failed\n",filename);
    uVar1 = 1;
  }
  goto LAB_0010b52e;
}

Assistant:

static int
regexpTest(const char *filename, const char *result, const char *err,
	   int options ATTRIBUTE_UNUSED) {
    xmlRegexpPtr comp = NULL;
    FILE *input, *output;
    char *temp;
    char expression[5000];
    int len, ret, res = 0;

    /*
     * TODO: Custom error handler for regexp
     */
    xmlSetStructuredErrorFunc(NULL, testStructuredErrorHandler);

    nb_tests++;

    input = fopen(filename, "rb");
    if (input == NULL) {
        fprintf(stderr,
		"Cannot open %s for reading\n", filename);
	ret = -1;
        goto done;
    }
    temp = resultFilename(filename, "", ".res");
    if (temp == NULL) {
        fprintf(stderr, "Out of memory\n");
        fatalError();
    }
    output = fopen(temp, "wb");
    if (output == NULL) {
	fprintf(stderr, "failed to open output file %s\n", temp);
        free(temp);
	ret = -1;
        goto done;
    }
    while (fgets(expression, 4500, input) != NULL) {
	len = strlen(expression);
	len--;
	while ((len >= 0) &&
	       ((expression[len] == '\n') || (expression[len] == '\t') ||
		(expression[len] == '\r') || (expression[len] == ' '))) len--;
	expression[len + 1] = 0;
	if (len >= 0) {
	    if (expression[0] == '#')
		continue;
	    if ((expression[0] == '=') && (expression[1] == '>')) {
		char *pattern = &expression[2];

		if (comp != NULL) {
		    xmlRegFreeRegexp(comp);
		    comp = NULL;
		}
		fprintf(output, "Regexp: %s\n", pattern) ;
		comp = xmlRegexpCompile((const xmlChar *) pattern);
		if (comp == NULL) {
		    fprintf(output, "   failed to compile\n");
		    break;
		}
	    } else if (comp == NULL) {
		fprintf(output, "Regexp: %s\n", expression) ;
		comp = xmlRegexpCompile((const xmlChar *) expression);
		if (comp == NULL) {
		    fprintf(output, "   failed to compile\n");
		    break;
		}
	    } else if (comp != NULL) {
		testRegexp(output, comp, expression);
	    }
	}
    }
    fclose(output);
    fclose(input);
    if (comp != NULL)
	xmlRegFreeRegexp(comp);

    ret = compareFiles(temp, result);
    if (ret) {
        fprintf(stderr, "Result for %s failed in %s\n", filename, result);
        res = 1;
    }
    if (temp != NULL) {
        unlink(temp);
        free(temp);
    }

    ret = compareFileMem(err, testErrors, testErrorsSize);
    if (ret != 0) {
        fprintf(stderr, "Error for %s failed\n", filename);
        res = 1;
    }

done:
    xmlSetStructuredErrorFunc(NULL, NULL);

    return(res);
}